

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O2

void * __thiscall
Js::AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>::Get
          (AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
           *this,AuxPointerType e)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  
  if (this->count != '\x03') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,0x5a,"(count == _MaxCount)","count == _MaxCount");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (lVar5 == 3) {
      return (void *)0x0;
    }
    lVar2 = lVar5 + 1;
  } while (this->type[lVar5] != e);
  return this->ptr[lVar5].ptr;
}

Assistant:

inline void* AuxPtrsFix<FieldsEnum, size, _MaxCount>::Get(FieldsEnum e)
    {
        Assert(count == _MaxCount);
        for (uint8 i = 0; i < _MaxCount; i++) // using _MaxCount instead of count so compiler can optimize in case _MaxCount is 1.
        {
            if ((FieldsEnum) type[i] == e)
            {
                return ptr[i];
            }
        }
        return nullptr;
    }